

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O1

void __thiscall LASindex::LASindex(LASindex *this)

{
  this->start = 0;
  this->end = 0;
  this->full = 0;
  this->total = 0;
  this->cells = 0;
  this->spatial = (LASquadtree *)0x0;
  this->interval = (LASinterval *)0x0;
  this->have_interval = false;
  return;
}

Assistant:

LASindex::LASindex()
{
  spatial = 0;
  interval = 0;
  have_interval = FALSE;
  start = 0;
  end = 0;
  full = 0;
  total = 0;
  cells = 0;
}